

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O3

Read<double> __thiscall
Omega_h::graph_reduce<double>(Omega_h *this,Graph *a2b,Read<double> *b_data,Int width,Omega_h_Op op)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  Alloc *this_00;
  Alloc *this_01;
  void *pvVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Read<signed_char> RVar8;
  Read<double> RVar9;
  Read<double> ab_data;
  LOs ab2b;
  LOs a2ab;
  LOs local_b8;
  LOs local_a8;
  Read<signed_char> local_98;
  Read<signed_char> local_88;
  Alloc *local_78;
  void *local_70;
  Alloc *local_68;
  Write<signed_char> local_60;
  Alloc *local_50;
  void *local_48;
  Alloc *local_40;
  void *local_38;
  
  local_40 = (a2b->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)(local_40->size * 8 + 1);
    }
    else {
      local_40->use_count = local_40->use_count + 1;
    }
  }
  this_01 = local_40;
  pvVar4 = (a2b->a2ab).write_.shared_alloc_.direct_ptr;
  local_50 = (a2b->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50 = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  this_00 = local_50;
  local_a8.write_.shared_alloc_.direct_ptr = (a2b->ab2b).write_.shared_alloc_.direct_ptr;
  bVar5 = local_50 != (Alloc *)0x0;
  bVar6 = ((ulong)local_50 & 7) == 0;
  local_a8.write_.shared_alloc_.alloc = local_50;
  if (bVar6 && bVar5) {
    if (entering_parallel == '\x01') {
      local_a8.write_.shared_alloc_.alloc = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_88.write_.shared_alloc_.alloc = (b_data->write_).shared_alloc_.alloc;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.write_.shared_alloc_.alloc =
           (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.write_.shared_alloc_.alloc)->use_count =
           (local_88.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.write_.shared_alloc_.direct_ptr = (b_data->write_).shared_alloc_.direct_ptr;
  local_68 = (Alloc *)this;
  local_48 = local_a8.write_.shared_alloc_.direct_ptr;
  local_38 = pvVar4;
  unmap<double>((Omega_h *)&local_60,&local_a8,&local_88,width);
  read<double>((Omega_h *)&local_78,&local_60);
  if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 && local_60.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_60.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.shared_alloc_.alloc);
      operator_delete(local_60.shared_alloc_.alloc,0x48);
    }
  }
  pAVar3 = local_88.write_.shared_alloc_.alloc;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_a8.write_.shared_alloc_.alloc;
  if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_68;
  bVar7 = ((ulong)this_01 & 7) == 0;
  local_b8.write_.shared_alloc_.alloc = this_01;
  if (bVar7 && this_01 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8.write_.shared_alloc_.alloc = (Alloc *)(this_01->size * 8 + 1);
    }
    else {
      this_01->use_count = this_01->use_count + 1;
    }
  }
  local_98.write_.shared_alloc_.alloc = local_78;
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc = (Alloc *)(local_78->size * 8 + 1);
    }
    else {
      local_78->use_count = local_78->use_count + 1;
    }
  }
  local_98.write_.shared_alloc_.direct_ptr = local_70;
  local_b8.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar8 = fan_reduce<double>((Omega_h *)local_68,&local_b8,&local_98,width,op);
  pAVar2 = local_98.write_.shared_alloc_.alloc;
  pvVar4 = RVar8.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX;
    }
  }
  pAVar2 = local_b8.write_.shared_alloc_.alloc;
  if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
    piVar1 = &local_78->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78);
      operator_delete(local_78,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  if (bVar6 && bVar5) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  if (bVar7 && this_01 != (Alloc *)0x0) {
    piVar1 = &this_01->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_01);
      operator_delete(this_01,0x48);
      pvVar4 = extraout_RDX_03;
    }
  }
  RVar9.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar9.write_.shared_alloc_.alloc = pAVar3;
  return (Read<double>)RVar9.write_.shared_alloc_;
}

Assistant:

Read<T> graph_reduce(Graph a2b, Read<T> b_data, Int width, Omega_h_Op op) {
  auto a2ab = a2b.a2ab;
  auto ab2b = a2b.ab2b;
  auto ab_data = read(unmap(ab2b, b_data, width));
  return fan_reduce(a2ab, ab_data, width, op);
}